

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  ProgramResult *this;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  undefined1 local_1190 [8];
  ToolOptions options;
  ofstream dst;
  undefined1 local_c20 [8];
  ProgramResult result;
  string local_a98 [32];
  string local_a78 [32];
  _Any_data local_a58;
  code *local_a48;
  code *local_a40;
  _Any_data local_a38;
  code *local_a28;
  code *local_a20;
  _Any_data local_a18;
  code *local_a08;
  code *local_a00;
  _Any_data local_9f8;
  code *local_9e8;
  code *local_9e0;
  _Any_data local_9d8;
  code *local_9c8;
  code *local_9c0;
  _Any_data local_9b8;
  code *local_9a8;
  code *local_9a0;
  _Any_data local_998;
  code *local_988;
  code *local_980;
  _Any_data local_978;
  code *local_968;
  code *local_960;
  string local_958;
  string local_938;
  _Any_data local_918;
  code *local_908;
  code *local_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *local_8e0;
  _Any_data local_8d8;
  code *local_8c8;
  code *local_8c0;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470 [32];
  string local_450;
  string local_430;
  undefined1 local_410 [32];
  string local_3f0;
  string local_3d0;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  string local_238 [8];
  string binDir;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  undefined1 local_1d8 [8];
  string input;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  undefined1 local_198 [8];
  ProgramResult resultOnValid;
  string command;
  ProgramResult resultOnInvalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong local_d8;
  undefined1 local_d0 [8];
  string test;
  string working;
  string WasmReduceOption;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  uint local_3c;
  bool local_35;
  bool local_34;
  char local_33;
  bool local_32;
  bool local_31 [4];
  bool deNan;
  bool verbose;
  bool force;
  bool debugInfo;
  bool binary;
  
  local_1d8 = (undefined1  [8])&input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  local_d0 = (undefined1  [8])&test._M_string_length;
  test._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  test.field_2._8_8_ = &working._M_string_length;
  working._M_dataplus._M_p = (pointer)0x0;
  resultOnValid.time = (double)&command._M_string_length;
  command._M_dataplus._M_p = (pointer)0x0;
  test._M_string_length._0_1_ = 0;
  working._M_string_length._0_1_ = 0;
  command._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,*argv,(allocator<char> *)local_c20);
  wasm::Path::getDirName(local_238);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  local_31[0] = true;
  local_35 = false;
  local_34 = false;
  local_32 = false;
  local_33 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(working.field_2._M_local_buf + 8),"wasm-reduce options",
             (allocator<char> *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"wasm-reduce",(allocator<char> *)local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c20,
             "Reduce a wasm file to a smaller one with the same behavior on a given command.\n\nTypical usage:\n\n  wasm-reduce orig.wasm \'--command=bash a.sh\' --test t.wasm --working w.wasm\n\nThe original file orig.wasm is where we begin. We then repeatedly test a small\nreduction of it by writing that modification to the \'test file\' (specified by\n\'--test\'), and we run the command, in this example \'bash a.sh\'. That command\nshould use the test file (and not the original file or any other one). Whenever\nthe reduction works, we write that new smaller file to the \'working file\'\n(specified by \'--working\'). The reduction \'works\' if it correctly preserves the\nbehavior of the command on the original input, specifically, that it has the\nsame stdout and the result return code. Each time reduction works we continue to\nreduce from that point (and each time it fails, we go back and try something\nelse).\n\nAs mentioned above, the command should run on the test file. That is, the first\nthing that wasm-reduce does on the example above is, effectively,\n\n  cp orig.wasm t.wasm\n  bash a.sh\n\nIn other words, it copies the original to the test file, and runs the command.\nWhatever the command does, we will preserve as we copy progressively smaller\nfiles to t.wasm. As we make progress, the smallest file will be written to\nthe working file, w.wasm, and when reduction is done you will find the final\nresult there.\n\nComparison to creduce:\n\n1. creduce requires the command to return 0. wasm-reduce is often used to reduce\n   crashes, which have non-zero return codes, so it is natural to allow any\n   return code. As mentioned above, we preserve the return code as we reduce.\n2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part\n   of the principle of preserving the original behavior of the command (if your\n   stdout varies in uninteresting ways, your command can be a script that runs\n   the real command and captures stdout to /dev/null, or filters it).\n3. creduce tramples the original input file as it reduces. wasm-reduce never\n   modifies th..." /* TRUNCATED STRING LITERAL */
             ,(allocator<char> *)(&command.field_2._M_allocated_capacity + 1));
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1190,(string *)&options.enabledFeatures,(string *)local_c20);
  std::__cxx11::string::~string((string *)local_c20);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"--command",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c20,"-cmd",&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b0,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,&local_5f);
  resultOnInvalid.code = 0;
  resultOnInvalid._4_4_ = 0;
  command.field_2._8_8_ = &resultOnValid.time;
  resultOnInvalid.output._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1317:10)>
       ::_M_invoke;
  resultOnInvalid.output._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1317:10)>
                ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add((string *)&options,(string *)&options.enabledFeatures,
                              (string *)local_c20,(string *)local_2b0,(int)&working + 0x18,
                              (function *)0x1,
                              SUB81((allocator<char> *)(&command.field_2._M_allocated_capacity + 1),
                                    0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_198,"--test",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&resultOnInvalid.time,"-t",&local_5d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,
             "Test file (this will be written to test, the given command should read it when we call it)"
             ,&local_5c);
  local_1f8._8_8_ = 0;
  local_1f8._M_unused._M_object = local_d0;
  local_1e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1324:10)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1324:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)local_198,(string *)&resultOnInvalid.time,
                              (string *)&local_f8,(int)&working + 0x18,(function *)0x1,
                              SUB81(&local_1f8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input.field_2._M_local_buf + 8),"--working",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(binDir.field_2._M_local_buf + 8),"-w",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b0,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,&local_59);
  local_a58._8_8_ = 0;
  local_a58._M_unused._0_8_ = (undefined8)((long)&test.field_2 + 8);
  local_a40 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1332:10)>
              ::_M_invoke;
  local_a48 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1332:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)(input.field_2._M_local_buf + 8),
                              (string *)(binDir.field_2._M_local_buf + 8),local_8b0,
                              (int)&working + 0x18,(function *)0x1,SUB81(&local_a58,0));
  std::__cxx11::string::string<std::allocator<char>>(local_890,"--binaries",&local_58);
  std::__cxx11::string::string<std::allocator<char>>(local_870,"-b",&local_57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_850,"binaryen binaries location (bin/ directory)",&local_56);
  local_a38._8_8_ = 0;
  local_a20 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1338:10)>
              ::_M_invoke;
  local_a28 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1338:10)>
              ::_M_manager;
  local_a38._M_unused._0_8_ = (undefined8)local_238;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_890,local_870,local_850,(int)&working + 0x18,
                              (function *)0x1,SUB81(&local_a38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_830,"--text",&local_55);
  std::__cxx11::string::string<std::allocator<char>>(local_810,"-S",&local_54);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7f0,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,&local_53);
  local_a18._8_8_ = 0;
  local_a18._M_unused._M_object = local_31;
  local_a00 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1348:10)>
              ::_M_invoke;
  local_a08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1348:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_830,local_810,local_7f0,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_a18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"--denan",&local_52);
  std::__cxx11::string::string<std::allocator<char>>(local_7b0,"",&local_51);
  std::__cxx11::string::string<std::allocator<char>>(local_790,"Avoid nans when reducing",&local_50)
  ;
  local_9f8._8_8_ = 0;
  local_9f8._M_unused._M_object = &local_35;
  local_9e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1354:10)>
              ::_M_invoke;
  local_9e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1354:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_7d0,local_7b0,local_790,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_9f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_770,"--verbose",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>(local_750,"-v",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>(local_730,"Verbose output mode",&local_4d);
  local_9d8._8_8_ = 0;
  local_9d8._M_unused._M_object = &local_34;
  local_9c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1360:10)>
              ::_M_invoke;
  local_9c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1360:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_770,local_750,local_730,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_9d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_710,"--debugInfo",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_6f0,"-g",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d0,"Keep debug info in binaries",&local_4a);
  local_9b8._8_8_ = 0;
  local_9b8._M_unused._M_object = &local_32;
  local_9a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1366:10)>
              ::_M_invoke;
  local_9a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1366:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_710,local_6f0,local_6d0,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_9b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,"--force",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_690,"-f",&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_670,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             &local_47);
  local_998._8_8_ = 0;
  local_980 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1373:10)>
              ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1373:10)>
              ::_M_manager;
  local_998._M_unused._M_object = &local_33;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_6b0,local_690,local_670,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_998,0));
  std::__cxx11::string::string<std::allocator<char>>(local_650,"--timeout",&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_630,"-to",&local_45);
  std::__cxx11::string::string<std::allocator<char>>
            (local_610,
             "A timeout to apply to each execution of the command, in seconds (default: 2)",
             &local_44);
  local_918._M_unused._M_object = (void *)0x0;
  local_918._8_8_ = 0;
  local_900 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1380:10)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1380:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_650,local_630,local_610,(int)&working + 0x18,
                              (function *)0x1,SUB81(&local_918,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,"--extra-flags",&local_43);
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,"-ef",&local_42);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b0,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             &local_41);
  local_8f8._M_unused._M_object = (void *)0x0;
  local_8f8._8_8_ = 0;
  local_8e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1390:10)>
              ::_M_invoke;
  local_8e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1390:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_5f0,local_5d0,local_5b0,(int)&working + 0x18,
                              (function *)0x1,SUB81(&local_8f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_590,"--save-all-working",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_570,"-saw",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"Save all intermediate working files, as $WORKING.0, .1, .2 etc",&local_3e);
  local_8d8._M_unused._M_object = (void *)0x0;
  local_8d8._8_8_ = 0;
  local_8c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1399:10)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1399:10)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_590,local_570,local_550,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_8d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_530,"INFILE",&local_3d);
  local_978._8_8_ = 0;
  local_978._M_unused._M_object = local_1d8;
  local_960 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1406:7)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1406:7)>
              ::_M_manager;
  wasm::Options::add_positional(psVar2,(Arguments)local_530,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_978);
  std::__cxx11::string::~string(local_530);
  std::_Function_base::~_Function_base((_Function_base *)&local_8d8);
  std::__cxx11::string::~string(local_550);
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string(local_590);
  std::_Function_base::~_Function_base((_Function_base *)&local_8f8);
  std::__cxx11::string::~string(local_5b0);
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::string::~string(local_5f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_918);
  std::__cxx11::string::~string(local_610);
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_650);
  std::_Function_base::~_Function_base((_Function_base *)&local_998);
  std::__cxx11::string::~string(local_670);
  std::__cxx11::string::~string(local_690);
  std::__cxx11::string::~string(local_6b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_9b8);
  std::__cxx11::string::~string(local_6d0);
  std::__cxx11::string::~string(local_6f0);
  std::__cxx11::string::~string(local_710);
  std::_Function_base::~_Function_base((_Function_base *)&local_9d8);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_770);
  std::_Function_base::~_Function_base((_Function_base *)&local_9f8);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_7b0);
  std::__cxx11::string::~string(local_7d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a18);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string(local_810);
  std::__cxx11::string::~string(local_830);
  std::_Function_base::~_Function_base((_Function_base *)&local_a38);
  std::__cxx11::string::~string(local_850);
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_890);
  std::_Function_base::~_Function_base((_Function_base *)&local_a58);
  std::__cxx11::string::~string(local_8b0);
  std::__cxx11::string::~string((string *)(binDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&resultOnInvalid.time);
  std::__cxx11::string::~string((string *)local_198);
  std::_Function_base::~_Function_base((_Function_base *)((long)&command.field_2 + 8));
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)local_c20);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  if (local_32 == true) {
    std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  }
  if (test._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"test file not provided\n");
  }
  else {
    if (working._M_dataplus._M_p != (pointer)0x0) {
      if (local_31[0] == false) {
        Colors::setEnabled(false);
      }
      wasm::Path::setBinaryenBinDir(local_238);
      std::operator<<((ostream *)&std::cerr,"|wasm-reduce\n");
      poVar3 = std::operator<<((ostream *)&std::cerr,"|input: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1d8);
      std::operator<<(poVar3,'\n');
      poVar3 = std::operator<<((ostream *)&std::cerr,"|test: ");
      poVar3 = std::operator<<(poVar3,(string *)local_d0);
      std::operator<<(poVar3,'\n');
      poVar3 = std::operator<<((ostream *)&std::cerr,"|working: ");
      poVar3 = std::operator<<(poVar3,(string *)(test.field_2._M_local_buf + 8));
      std::operator<<(poVar3,'\n');
      poVar3 = std::operator<<((ostream *)&std::cerr,"|bin dir: ");
      poVar3 = std::operator<<(poVar3,local_238);
      std::operator<<(poVar3,'\n');
      poVar3 = std::operator<<((ostream *)&std::cerr,"|extra flags: ");
      poVar3 = std::operator<<(poVar3,(string *)&extraFlags_abi_cxx11_);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::string(local_510,(string *)local_1d8);
      std::__cxx11::string::string(local_4f0,(string *)local_d0);
      wasm::copy_file(local_510,local_4f0);
      std::__cxx11::string::~string(local_4f0);
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::string((string *)&local_4d0,(string *)&resultOnValid.time);
      ProgramResult::getFromExecution(&expected,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      poVar3 = std::operator<<((ostream *)&std::cerr,"|expected result:\n");
      ProgramResult::dump(&expected,poVar3);
      std::operator<<(poVar3,'\n');
      std::operator<<((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n");
      input.field_2._8_8_ = &local_33;
      if (((double)CONCAT44(0x45300000,(int)(timeout >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,
                   "execution time is dangerously close to the timeout - you should probably increase the timeout"
                   ,(allocator<char> *)&options.enabledFeatures);
        main::anon_class_8_1_a7eb7a0b::operator()
                  ((anon_class_8_1_a7eb7a0b *)((long)&input.field_2 + 8),&local_4b0,&expected);
        std::__cxx11::string::~string((string *)&local_4b0);
      }
      if (local_33 == '\0') {
        std::operator<<((ostream *)&std::cerr,
                        "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
                       );
        std::ofstream::ofstream(&options.enabledFeatures,(string *)local_d0,_S_bin);
        std::operator<<((ostream *)&options.enabledFeatures,"waka waka\n");
        std::ofstream::~ofstream(&options.enabledFeatures);
        std::__cxx11::string::string((string *)&local_490,(string *)&resultOnValid.time);
        ProgramResult::ProgramResult((ProgramResult *)((long)&command.field_2 + 8),&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        bVar1 = ProgramResult::operator==((ProgramResult *)((long)&command.field_2 + 8),&expected);
        if (bVar1) {
          wasm::Module::Module((Module *)&options.enabledFeatures);
          cmd._M_dataplus._M_p = &options.field_0xb0;
          cmd.field_2._M_allocated_capacity = (size_type)&local_288;
          cmd.field_2._8_8_ = 0;
          local_288._M_local_buf[0] = '\0';
          local_278._M_p = (pointer)&local_268;
          local_270 = 0;
          local_268._M_local_buf[0] = '\0';
          local_258._M_p = (pointer)&local_248;
          local_250 = 0;
          local_248._M_local_buf[0] = '\0';
          local_2b0[0] = false;
          cmd._M_string_length._0_2_ = 1;
          std::__cxx11::string::string(local_470,(string *)local_d0);
          wasm::ModuleWriter::write(local_2b0,&options.enabledFeatures,local_470);
          std::__cxx11::string::~string(local_470);
          std::__cxx11::string::string((string *)&local_450,(string *)&resultOnValid.time);
          ProgramResult::ProgramResult((ProgramResult *)local_198,&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          bVar1 = ProgramResult::operator==((ProgramResult *)local_198,&expected);
          if (bVar1) {
            wasm::Fatal::Fatal((Fatal *)local_c20);
            std::operator+(&local_f8,
                           "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &resultOnInvalid.time,&local_f8,")? (use -f to ignore this check)");
            wasm::Fatal::operator<<
                      ((Fatal *)local_c20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &resultOnInvalid.time);
            std::__cxx11::string::~string((string *)&resultOnInvalid.time);
            std::__cxx11::string::~string((string *)&local_f8);
            wasm::Fatal::~Fatal((Fatal *)local_c20);
          }
          std::__cxx11::string::~string((string *)&resultOnValid);
          wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_2b0);
          wasm::Module::~Module((Module *)&options.enabledFeatures);
        }
        std::__cxx11::string::~string((string *)&resultOnInvalid);
      }
      std::operator<<((ostream *)&std::cerr,
                      "|checking that command has expected behavior on canonicalized (read-written) binary\n"
                     );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f8._M_pod_data,"wasm-opt",
                 (allocator<char> *)(binDir.field_2._M_local_buf + 8));
      wasm::Path::getBinaryenBinaryTool((string *)&local_f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultOnInvalid.time,&local_f8," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultOnInvalid.time,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&command.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     " -o ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&command.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &options.enabledFeatures,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c20,
                     " ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &options.enabledFeatures,&extraFlags_abi_cxx11_);
      std::__cxx11::string::~string((string *)&options.enabledFeatures);
      std::__cxx11::string::~string((string *)local_c20);
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_198);
      std::__cxx11::string::~string((string *)&resultOnInvalid.time);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)local_1f8._M_pod_data);
      if (local_31[0] == false) {
        std::__cxx11::string::append(local_2b0);
      }
      std::__cxx11::string::string((string *)&local_430,(string *)local_2b0);
      ProgramResult::ProgramResult((ProgramResult *)&options.enabledFeatures,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      if (options.enabledFeatures.features == 0) {
        std::__cxx11::string::string((string *)(local_410 + 0x20),(string *)&resultOnValid.time);
        ProgramResult::ProgramResult((ProgramResult *)local_c20,(string *)(local_410 + 0x20));
        std::__cxx11::string::~string((string *)(local_410 + 0x20));
        bVar1 = ProgramResult::operator!=((ProgramResult *)local_c20,&expected);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,
                     "running command on the canonicalized module should give the same results",
                     (allocator<char> *)(command.field_2._M_local_buf + 8));
          main::anon_class_8_1_a7eb7a0b::operator()
                    ((anon_class_8_1_a7eb7a0b *)((long)&input.field_2 + 8),&local_3d0,
                     (ProgramResult *)local_c20);
          std::__cxx11::string::~string((string *)&local_3d0);
        }
        this = &result;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_410,"failed to read and write the binary",
                   (allocator<char> *)local_c20);
        main::anon_class_8_1_a7eb7a0b::operator()
                  ((anon_class_8_1_a7eb7a0b *)((long)&input.field_2 + 8),(string *)local_410,
                   (ProgramResult *)&options.enabledFeatures);
        this = (ProgramResult *)local_410;
      }
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)&dst);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::string(local_3b0,(string *)local_1d8);
      std::__cxx11::string::string(local_390,(string *)(test.field_2._M_local_buf + 8));
      wasm::copy_file(local_3b0,local_390);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::string(local_370,(string *)(test.field_2._M_local_buf + 8));
      uVar4 = wasm::file_size(local_370);
      std::__cxx11::string::~string(local_370);
      poVar3 = std::operator<<((ostream *)&std::cerr,"|input size: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\n");
      std::operator<<((ostream *)&std::cerr,"|starting reduction!\n");
      if (local_31[0] == true) {
        uVar4 = uVar4 * 2;
      }
      else {
        uVar4 = uVar4 / 10;
      }
      local_d8 = 0;
      WasmReduceOption.field_2._8_8_ = 0;
      sVar7 = 0;
      do {
        std::__cxx11::string::string((string *)&local_350,(string *)&resultOnValid.time);
        std::__cxx11::string::string((string *)&local_958,(string *)local_d0);
        std::__cxx11::string::string((string *)&local_938,(string *)(test.field_2._M_local_buf + 8))
        ;
        Reducer::Reducer((Reducer *)&options.enabledFeatures,&local_350,&local_958,&local_938,
                         local_31[0],local_35,local_34,local_32,(ToolOptions *)local_1190);
        std::__cxx11::string::~string((string *)&local_938);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_350);
        std::operator<<((ostream *)&std::cerr,"|  reduce using passes...\n");
        std::__cxx11::string::string(local_a98,(string *)(test.field_2._M_local_buf + 8));
        lVar5 = wasm::file_size(local_a98);
        std::__cxx11::string::~string(local_a98);
        Reducer::reduceUsingPasses((Reducer *)&options.enabledFeatures);
        std::__cxx11::string::string(local_a78,(string *)(test.field_2._M_local_buf + 8));
        uVar6 = wasm::file_size(local_a78);
        std::__cxx11::string::~string(local_a78);
        poVar3 = std::operator<<((ostream *)&std::cerr,"|  after pass reduction: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"\n");
        local_3c = (uint)CONCAT71((int7)((ulong)poVar3 >> 8),1);
        if ((WasmReduceOption.field_2._8_8_ & 1) == 0) {
          if (local_d8 - 1 < uVar6) {
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     "|  progress has stopped, skipping to the end\n");
            local_3c = (uint)CONCAT71((int7)((ulong)poVar3 >> 8),1);
            uVar8 = 1;
            if ((int)uVar4 != 1) {
              uVar8 = (long)((int)uVar4 + 1) / 2 & 0xffffffff;
              local_3c = 0;
            }
          }
          else {
            local_3c = 0;
            uVar8 = uVar4 & 0xffffffff;
          }
          poVar3 = std::operator<<((ostream *)&std::cerr,"|  pass progress: ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,", last destructive: ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<(poVar3,'\n');
          iVar10 = (int)uVar8;
          if (lVar5 - uVar6 < sVar7 << 2) {
            if (iVar10 < 0xb) {
              uVar9 = (iVar10 + 1) / 2;
            }
            else {
              uVar9 = (int)(uVar8 / 3) + 1;
            }
          }
          else {
            std::operator<<((ostream *)&std::cerr,
                            "|  progress is good, do not quickly decrease factor\n");
            uVar9 = (iVar10 * 9) / 10;
            if ((int)uVar9 < 2) {
              uVar9 = 1;
            }
          }
          if (uVar6 < 5) {
            __assert_fail("newSize > 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                          ,0x624,"int main(int, const char **)");
          }
          uVar8 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / 4;
          uVar4 = (ulong)uVar9;
          if ((int)uVar8 < (int)uVar9) {
            uVar4 = uVar8 & 0xffffffff;
          }
          while( true ) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"|  reduce destructively... (factor: ");
            iVar10 = (int)uVar4;
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar10);
            std::operator<<(poVar3,")\n");
            sVar7 = Reducer::reduceDestructively((Reducer *)&options.enabledFeatures,iVar10);
            if (sVar7 != 0) break;
            if (iVar10 == 1) {
              local_3c = 1;
              uVar4 = 1;
              break;
            }
            uVar4 = (long)iVar10 / 4;
            if ((int)((long)iVar10 / 4) < 2) {
              uVar4 = 1;
            }
            uVar4 = uVar4 & 0xffffffff;
          }
          poVar3 = std::operator<<((ostream *)&std::cerr,"|  destructive reduction led to size: ");
          std::__cxx11::string::string(local_330,(string *)(test.field_2._M_local_buf + 8));
          wasm::file_size(local_330);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<(poVar3,'\n');
          std::__cxx11::string::~string(local_330);
          local_d8 = uVar6;
        }
        Reducer::~Reducer((Reducer *)&options.enabledFeatures);
        uVar6 = WasmReduceOption.field_2._8_8_ & 1;
        WasmReduceOption.field_2._8_8_ = ZEXT48(local_3c);
        if (uVar6 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"|finished, final size: ");
          std::__cxx11::string::string(local_310,(string *)(test.field_2._M_local_buf + 8));
          wasm::file_size(local_310);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string(local_310);
          std::__cxx11::string::string(local_2f0,(string *)(test.field_2._M_local_buf + 8));
          std::__cxx11::string::string(local_2d0,(string *)local_d0);
          wasm::copy_file(local_2f0,local_2d0);
          std::__cxx11::string::~string(local_2d0);
          std::__cxx11::string::~string(local_2f0);
          wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1190);
          std::__cxx11::string::~string((string *)(working.field_2._M_local_buf + 8));
          std::__cxx11::string::~string(local_238);
          std::__cxx11::string::~string((string *)&resultOnValid.time);
          std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_d0);
          std::__cxx11::string::~string((string *)local_1d8);
          return 0;
        }
      } while( true );
    }
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"working file not provided\n");
  }
  wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options(
    "wasm-reduce",
    R"(Reduce a wasm file to a smaller one with the same behavior on a given command.

Typical usage:

  wasm-reduce orig.wasm '--command=bash a.sh' --test t.wasm --working w.wasm

The original file orig.wasm is where we begin. We then repeatedly test a small
reduction of it by writing that modification to the 'test file' (specified by
'--test'), and we run the command, in this example 'bash a.sh'. That command
should use the test file (and not the original file or any other one). Whenever
the reduction works, we write that new smaller file to the 'working file'
(specified by '--working'). The reduction 'works' if it correctly preserves the
behavior of the command on the original input, specifically, that it has the
same stdout and the result return code. Each time reduction works we continue to
reduce from that point (and each time it fails, we go back and try something
else).

As mentioned above, the command should run on the test file. That is, the first
thing that wasm-reduce does on the example above is, effectively,

  cp orig.wasm t.wasm
  bash a.sh

In other words, it copies the original to the test file, and runs the command.
Whatever the command does, we will preserve as we copy progressively smaller
files to t.wasm. As we make progress, the smallest file will be written to
the working file, w.wasm, and when reduction is done you will find the final
result there.

Comparison to creduce:

1. creduce requires the command to return 0. wasm-reduce is often used to reduce
   crashes, which have non-zero return codes, so it is natural to allow any
   return code. As mentioned above, we preserve the return code as we reduce.
2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part
   of the principle of preserving the original behavior of the command (if your
   stdout varies in uninteresting ways, your command can be a script that runs
   the real command and captures stdout to /dev/null, or filters it).
3. creduce tramples the original input file as it reduces. wasm-reduce never
   modifies the input (to avoid mistakes that cause data loss). Instead,
   when reductions work we write to the 'working file' as mentioned above, and
   the final reduction will be there.
4. creduce runs the command in a temp directory. That is safer in general, but
   it is not how the original command ran, and in particular forces additional
   work if you have multiple files (which, for wasm-reduce, is common, e.g. if
   the testcase is a combination of JavaScript and wasm). wasm-reduce runs the
   command in the current directory (of course, your command can be a script
   that changes directory to anywhere else).

More documentation can be found at

  https://github.com/WebAssembly/binaryen/wiki/Fuzzing#reducing
                      )");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add("--save-all-working",
         "-saw",
         "Save all intermediate working files, as $WORKING.0, .1, .2 etc",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           saveAllWorkingFiles = true;
           std::cout << "|saving all intermediate working files\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer(options.passOptions);
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}